

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O0

void test_sfd_exchange(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  undefined4 uVar5;
  nng_err result__12;
  nng_err result__11;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__10;
  int rv_;
  size_t sz_;
  char buf_ [64];
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int fds [2];
  nng_listener l2;
  nng_listener l1;
  nng_socket s2;
  nng_socket s1;
  
  nVar1 = nng_socket_pair((int *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x90,"%s: expected success, got %s (%d)","nng_socket_pair(fds)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&l1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x91,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&l2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x92,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create((nng_listener *)(fds + 1),(nng_socket)l1.id,"socket://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x93,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l1, s1, \"socket://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_start((nng_listener)fds[1],0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x94,"%s: expected success, got %s (%d)","nng_listener_start(l1, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_int((nng_listener)fds[1],"socket:fd",result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x95,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds[0])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create((nng_listener *)fds,(nng_socket)l2.id,"socket://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x96,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l2, s2, \"socket://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_start((nng_listener)fds[0],0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x97,"%s: expected success, got %s (%d)","nng_listener_start(l2, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  buf_._60_4_ = nng_listener_set_int((nng_listener)fds[0],"socket:fd",result_);
  bVar4 = buf_._60_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf_._60_4_);
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x98,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds[1])",pcVar3,buf_._60_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nuts_sleep(10);
  buf_._56_4_ = nng_send((nng_socket)l1.id,"hello",6,0);
  bVar4 = buf_._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf_._56_4_);
  uVar5 = buf_._56_4_;
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x9a,"%s: expected success, got %s (%d)",
                         "nng_send(s1, \"hello\", strlen(\"hello\") + 1, 0)",pcVar3,buf_._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__10 = 0x40;
  nVar1 = nng_recv((nng_socket)l2.id,&sz_,(size_t *)&result__10,0);
  buf__1._60_4_ = nVar1;
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9b,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
  acutest_check_((uint)(_result__10 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9b,"length %d want %d",_result__10 & 0xffffffff,6);
  buf_[0x37] = '\0';
  iVar2 = strcmp("hello",(char *)&sz_);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9b,"%s == %s","hello",&sz_);
  buf__1._56_4_ = nng_send((nng_socket)l2.id,"there",6,0);
  bVar4 = buf__1._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf__1._56_4_);
  uVar5 = buf__1._56_4_;
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x9c,"%s: expected success, got %s (%d)",
                         "nng_send(s2, \"there\", strlen(\"there\") + 1, 0)",pcVar3,buf__1._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__11 = 0x40;
  nVar1 = nng_recv((nng_socket)l1.id,&sz__1,(size_t *)&result__11,0);
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9d,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
  acutest_check_((uint)(_result__11 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9d,"length %d want %d",_result__11 & 0xffffffff,6);
  buf__1[0x37] = '\0';
  iVar2 = strcmp("there",(char *)&sz__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x9d,"%s == %s","there",&sz__1);
  nVar1 = nng_socket_close((nng_socket)l1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x9f,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)l2.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0xa0,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  close(result_);
  return;
}

Assistant:

void
test_sfd_exchange(void)
{
#ifdef NNG_HAVE_SOCKETPAIR
	nng_socket   s1, s2;
	nng_listener l1, l2;
	int          fds[2];

	NUTS_PASS(nng_socket_pair(fds));
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_listener_create(&l1, s1, "socket://"));
	NUTS_PASS(nng_listener_start(l1, 0));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds[0]));
	NUTS_PASS(nng_listener_create(&l2, s2, "socket://"));
	NUTS_PASS(nng_listener_start(l2, 0));
	NUTS_PASS(nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds[1]));
	NUTS_SLEEP(10);
	NUTS_SEND(s1, "hello");
	NUTS_RECV(s2, "hello");
	NUTS_SEND(s2, "there");
	NUTS_RECV(s1, "there");

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	close(fds[1]);
#else
	NUTS_SKIP("no socketpair");
#endif
}